

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

int ON_BrepMergeFaces(ON_Brep *B,int fid0,int fid1)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  int *piVar4;
  ON_BrepLoop *loop;
  int iVar5;
  int iVar6;
  ON_BrepEdge *pOVar7;
  ON_BrepFace *pOVar8;
  ON_Surface *pOVar9;
  int tid1;
  ON_BrepFace *pOVar10;
  long lVar11;
  long lVar12;
  ON_BrepFace *pOVar13;
  ON_BrepTrim *pOVar14;
  ON_BrepTrim *pOVar15;
  ON_BrepEdge *pOVar16;
  ON_BrepEdge *pOVar17;
  ON_BrepLoop *pOVar18;
  ON_BrepLoop *pOVar19;
  bool bVar20;
  ON_SimpleArray<int> new_tids;
  ulong local_80;
  ON_SimpleArray<int> local_48;
  
  iVar6 = -1;
  if (((-1 < fid0 && fid0 != fid1) &&
      (iVar5 = (B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count,
      fid0 < iVar5)) && (fid1 < iVar5)) {
    pOVar10 = (B->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    if ((-1 < (pOVar10[(uint)fid0].m_face_index | fid1)) && (-1 < pOVar10[fid1].m_face_index)) {
      pOVar13 = pOVar10 + (uint)fid0;
      pOVar10 = pOVar10 + fid1;
      if (pOVar13->m_si == pOVar10->m_si) {
        if ((pOVar13->m_li).m_count < 1) {
          bVar20 = true;
          local_80 = 0xffffffff;
          uVar1 = 0xffffffff;
        }
        else {
          uVar1 = 0xffffffff;
          lVar11 = 0;
          pOVar16 = (ON_BrepEdge *)0x0;
          local_80 = 0xffffffff;
          do {
            iVar6 = (pOVar13->m_li).m_a[lVar11];
            pOVar18 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                      m_a;
            if (0 < pOVar18[iVar6].m_ti.m_count) {
              lVar12 = 1;
              pOVar17 = pOVar16;
              do {
                pOVar15 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a +
                          pOVar18[iVar6].m_ti.m_a[lVar12 + -1];
                pOVar7 = ON_BrepTrim::Edge(pOVar15);
                pOVar16 = pOVar17;
                if ((pOVar7 == (ON_BrepEdge *)0x0) || ((pOVar7->m_ti).m_count != 2)) {
                  bVar20 = false;
                }
                else {
                  uVar1 = pOVar15->m_trim_index;
                  puVar3 = (uint *)(pOVar7->m_ti).m_a;
                  uVar2 = puVar3[*puVar3 == uVar1];
                  local_80 = (ulong)uVar2;
                  bVar20 = false;
                  if ((-1 < (int)uVar1) && (-1 < (int)uVar2)) {
                    pOVar14 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                              super_ON_ClassArray<ON_BrepTrim>.m_a + local_80;
                    iVar5 = ON_BrepTrim::FaceIndexOf(pOVar14);
                    if ((iVar5 != fid1) ||
                       ((pOVar15->m_bRev3d == pOVar14->m_bRev3d ||
                        (bVar20 = true, pOVar16 = pOVar7, pOVar15->m_iso != pOVar14->m_iso)))) {
                      bVar20 = false;
                      pOVar16 = pOVar17;
                    }
                  }
                }
              } while (((!bVar20) && (lVar12 < pOVar18[iVar6].m_ti.m_count)) &&
                      (lVar12 = lVar12 + 1, pOVar17 = pOVar16, pOVar16 == (ON_BrepEdge *)0x0));
            }
            lVar11 = lVar11 + 1;
            bVar20 = pOVar16 == (ON_BrepEdge *)0x0;
          } while ((lVar11 < (pOVar13->m_li).m_count) && (pOVar16 == (ON_BrepEdge *)0x0));
        }
        if (bVar20) {
          iVar6 = -1;
        }
        else {
          iVar6 = -1;
          if ((-1 < (int)uVar1) && (-1 < (int)local_80)) {
            pOVar15 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                      m_a;
            lVar11 = (long)pOVar15[uVar1].m_li;
            if (-1 < lVar11) {
              pOVar18 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                        m_a;
              if (-1 < pOVar18[lVar11].m_loop_index) {
                pOVar18 = pOVar18 + lVar11;
                pOVar8 = ON_BrepLoop::Face(pOVar18);
                if (pOVar8 == pOVar13) {
                  lVar11 = (long)(pOVar18->m_ti).m_count;
                  iVar6 = -1;
                  iVar5 = -1;
                  if (0 < lVar11) {
                    lVar12 = 0;
                    do {
                      iVar5 = (int)lVar12;
                      if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                          super_ON_ClassArray<ON_BrepTrim>.m_a[(pOVar18->m_ti).m_a[lVar12]].
                          m_trim_index == uVar1) break;
                      bVar20 = lVar11 + -1 != lVar12;
                      lVar12 = lVar12 + 1;
                      iVar5 = -1;
                    } while (bVar20);
                  }
                  if (-1 < iVar5) {
                    pOVar14 = pOVar15 + local_80;
                    lVar11 = (long)pOVar14->m_li;
                    if (-1 < lVar11) {
                      pOVar19 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                super_ON_ClassArray<ON_BrepLoop>.m_a;
                      if (-1 < pOVar19[lVar11].m_loop_index) {
                        pOVar19 = pOVar19 + lVar11;
                        pOVar8 = ON_BrepLoop::Face(pOVar19);
                        if (pOVar8 == pOVar10) {
                          lVar11 = (long)(pOVar19->m_ti).m_count;
                          tid1 = -1;
                          if (0 < lVar11) {
                            lVar12 = 0;
                            do {
                              tid1 = (int)lVar12;
                              if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                  super_ON_ClassArray<ON_BrepTrim>.m_a[(pOVar19->m_ti).m_a[lVar12]].
                                  m_trim_index == (int)local_80) break;
                              bVar20 = lVar11 + -1 != lVar12;
                              lVar12 = lVar12 + 1;
                              tid1 = -1;
                            } while (bVar20);
                          }
                          iVar6 = -1;
                          if (-1 < tid1) {
                            local_48._vptr_ON_SimpleArray =
                                 (_func_int **)&PTR__ON_SimpleArray_008176a8;
                            local_48.m_a = (int *)0x0;
                            local_48.m_count = 0;
                            local_48.m_capacity = 0;
                            CreateNewTrimList(pOVar18,iVar5,pOVar19,tid1,&local_48);
                            loop = pOVar19;
                            pOVar8 = pOVar13;
                            if (pOVar19->m_type == inner) {
                              fid0 = fid1;
                              loop = pOVar18;
                              pOVar18 = pOVar19;
                              pOVar8 = pOVar10;
                              pOVar10 = pOVar13;
                            }
                            ON_SimpleArray<int>::operator=(&pOVar18->m_ti,&local_48);
                            ON_BoundingBox::Destroy(&pOVar18->m_pbox);
                            if (-1 < (loop->m_ti).m_capacity) {
                              (loop->m_ti).m_count = 0;
                            }
                            pOVar15[uVar1].m_li = -1;
                            pOVar14->m_li = -1;
                            ON_Brep::DeleteTrim(B,pOVar15 + uVar1,true);
                            ON_Brep::DeleteTrim(B,pOVar14,true);
                            ON_Brep::DeleteLoop(B,loop,true);
                            lVar11 = (long)(pOVar18->m_ti).m_count;
                            if (0 < lVar11) {
                              iVar6 = pOVar18->m_loop_index;
                              piVar4 = (pOVar18->m_ti).m_a;
                              pOVar15 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                        super_ON_ClassArray<ON_BrepTrim>.m_a;
                              lVar12 = 0;
                              do {
                                pOVar15[piVar4[lVar12]].m_li = iVar6;
                                lVar12 = lVar12 + 1;
                              } while (lVar11 != lVar12);
                            }
                            ON_Brep::MatchTrimEnds(B,pOVar18);
                            if (0 < (pOVar10->m_li).m_count) {
                              lVar11 = 0;
                              do {
                                iVar6 = (pOVar10->m_li).m_a[lVar11];
                                pOVar18 = (B->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                                          super_ON_ClassArray<ON_BrepLoop>.m_a;
                                pOVar18[iVar6].m_fi = fid0;
                                ON_SimpleArray<int>::Append
                                          (&pOVar8->m_li,&pOVar18[iVar6].m_loop_index);
                                lVar11 = lVar11 + 1;
                              } while (lVar11 < (pOVar10->m_li).m_count);
                            }
                            if (-1 < (pOVar10->m_li).m_capacity) {
                              (pOVar10->m_li).m_count = 0;
                            }
                            ON_Brep::DeleteFace(B,pOVar10,true);
                            pOVar9 = ON_BrepFace::SurfaceOf
                                               ((B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                                super_ON_ClassArray<ON_BrepFace>.m_a + fid0);
                            iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object._vptr_ON_Object
                                      [0x30])(pOVar9,0);
                            if (((char)iVar6 != '\0') ||
                               (iVar6 = (*(pOVar9->super_ON_Geometry).super_ON_Object.
                                          _vptr_ON_Object[0x30])(pOVar9,1), (char)iVar6 != '\0')) {
                              ON_Brep::SetTrimTypeFlags
                                        (B,(B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                           super_ON_ClassArray<ON_BrepFace>.m_a + fid0,false);
                            }
                            ON_BrepRemoveSlits((B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                               super_ON_ClassArray<ON_BrepFace>.m_a + fid0);
                            (*(B->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                                      (B,(B->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                         super_ON_ClassArray<ON_BrepFace>.m_a + fid0,1);
                            ON_SimpleArray<int>::~ON_SimpleArray(&local_48);
                            iVar6 = fid0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int ON_BrepMergeFaces(ON_Brep& B, int fid0, int fid1)

{
  if (fid0 == fid1)
    return -1;

  if (fid0 < 0 || fid0 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F0 = B.m_F[fid0];
  if (F0.m_face_index < 0)
    return -1;

  if (fid1 < 0 || fid1 >= B.m_F.Count())
    return -1;
  ON_BrepFace& F1 = B.m_F[fid1];
  if (F1.m_face_index < 0)
    return -1;

  if (F0.m_si != F1.m_si)
    return -1;

  //Find a manifold edge that joins the two faces and combine the loops by removing 
  //the trims at that edge.

  ON_BrepEdge* pE = 0;

  int li;
  int tid0 = -1, tid1 = -1;
  for (li=0; li<F0.m_li.Count() && !pE; li++){
    ON_BrepLoop& L = B.m_L[F0.m_li[li]];
    int ti;
    for (ti=0; ti<L.m_ti.Count() && !pE; ti++){
      ON_BrepTrim& T0 = B.m_T[L.m_ti[ti]];
      ON_BrepEdge* pEE = T0.Edge();
      if (!pEE || pEE->m_ti.Count() != 2)
        continue;
      tid0 =T0.m_trim_index;
      tid1 = (pEE->m_ti[0] == tid0) ? pEE->m_ti[1] : pEE->m_ti[0];
      if (tid0 < 0 || tid1 < 0)
        continue;
      ON_BrepTrim& T1 = B.m_T[tid1];
      if (T1.FaceIndexOf() == fid1 && T0.m_bRev3d != T1.m_bRev3d 
        && T0.m_iso == T1.m_iso){//Don't combine across seams.
        pE = pEE;
        break;
      }
    }
  }

  if (!pE || tid0 < 0 || tid1 < 0)
    return -1;

  ON_BrepTrim& T0 = B.m_T[tid0];
  ON_BrepTrim& T1 = B.m_T[tid1];

  int lid0 = T0.m_li;
  if (lid0 < 0)
    return -1;
  ON_BrepLoop& L0 = B.m_L[lid0];
  if (L0.m_loop_index < 0)
    return -1;
  if (L0.Face() != &F0)
    return -1;
  int i;
  int ti0 = -1;
  for (i=0; i<L0.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L0.m_ti[i]];
    if (T.m_trim_index == tid0){
      ti0 = i;
      break;
    }
  }
  if (ti0 < 0)
    return -1;

  int lid1 = T1.m_li;
  if (lid1 < 0)
    return -1;
  ON_BrepLoop& L1 = B.m_L[lid1];
  if (L1.m_loop_index < 0)
    return -1;
  if (L1.Face() != &F1)
    return -1;
  int ti1 = -1;
  for (i=0; i<L1.m_ti.Count(); i++){
    const ON_BrepTrim& T = B.m_T[L1.m_ti[i]];
    if (T.m_trim_index == tid1){
      ti1 = i;
      break;
    }
  }
  if (ti1 < 0)
    return -1;


  ON_SimpleArray<int> new_tids;
  CreateNewTrimList(L0, ti0, L1, ti1, new_tids);

  ON_BrepLoop* pL;
  ON_BrepLoop* pD;
  ON_BrepFace* pF;
  ON_BrepFace* pDF;
  int rc;
  if (L1.m_type != ON_BrepLoop::inner){
    pL = &L0;
    pD = &L1;
    rc = fid0;
    pF = &F0;
    pDF = &F1;
  }
  else {
    pL = &L1;
    pD = &L0;
    rc = fid1;
    pF = &F1;
    pDF = &F0;
  }
  pL->m_ti = new_tids;
  pL->m_pbox.Destroy();
  pD->m_ti.SetCount(0);
  T0.m_li = -1;
  T1.m_li = -1;
  B.DeleteTrim(T0, true);
  B.DeleteTrim(T1, true);
  B.DeleteLoop(*pD, true);
  for (i=0; i<pL->m_ti.Count(); i++)
    B.m_T[pL->m_ti[i]].m_li = pL->m_loop_index;

  B.MatchTrimEnds(*pL);

  for (i=0; i<pDF->m_li.Count(); i++){
    ON_BrepLoop& ML = B.m_L[pDF->m_li[i]];
    ML.m_fi = rc;
    pF->m_li.Append(ML.m_loop_index);
  }
  pDF->m_li.SetCount(0);
  B.DeleteFace(*pDF, true);
  const ON_Surface* pSrf = B.m_F[rc].SurfaceOf();
  if (pSrf->IsClosed(0) || pSrf->IsClosed(1))
    B.SetTrimTypeFlags(B.m_F[rc]);//Some mateds may have become seams.
  ON_BrepRemoveSlits(B.m_F[rc]);

  B.SetTrimBoundingBoxes(B.m_F[rc], true);

  return rc;

}